

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O2

void __thiscall QPDFMatrix::rotatex90(QPDFMatrix *this,int angle)

{
  long lVar1;
  QPDFMatrix local_38;
  
  if (angle == 0x10e) {
    lVar1 = 0xbff00000;
    local_38.c = 1.0;
  }
  else {
    if (angle == 0xb4) {
      local_38.a = -1.0;
      local_38.b = 0.0;
      local_38.c = 0.0;
      local_38.d = -1.0;
      goto LAB_001951e5;
    }
    if (angle != 0x5a) {
      return;
    }
    lVar1 = 0x3ff00000;
    local_38.c = -1.0;
  }
  local_38.b = (double)(lVar1 << 0x20);
  local_38.a = 0.0;
  local_38.d = 0.0;
LAB_001951e5:
  local_38.f = 0.0;
  local_38.e = 0.0;
  concat(this,&local_38);
  return;
}

Assistant:

void
QPDFMatrix::rotatex90(int angle)
{
    switch (angle) {
    case 90:
        concat(QPDFMatrix(0, 1, -1, 0, 0, 0));
        break;
    case 180:
        concat(QPDFMatrix(-1, 0, 0, -1, 0, 0));
        break;
    case 270:
        concat(QPDFMatrix(0, -1, 1, 0, 0, 0));
        break;
    default:
        // ignore
        break;
    }
}